

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O1

cJSON_bool add_item_to_array(cJSON *array,cJSON *item)

{
  cJSON *pcVar1;
  cJSON *pcVar2;
  cJSON_bool cVar3;
  
  cVar3 = 0;
  if (((array != item) && (array != (cJSON *)0x0)) && (item != (cJSON *)0x0)) {
    pcVar1 = array->child;
    if (pcVar1 == (cJSON *)0x0) {
      array->child = item;
      item->prev = item;
      item->next = (cJSON *)0x0;
      cVar3 = 1;
    }
    else {
      pcVar2 = pcVar1->prev;
      cVar3 = 1;
      if (pcVar2 != (cJSON *)0x0) {
        pcVar2->next = item;
        item->prev = pcVar2;
        pcVar1->prev = item;
        return 1;
      }
    }
  }
  return cVar3;
}

Assistant:

static cJSON_bool add_item_to_array(cJSON *array, cJSON *item)
{
    cJSON *child = NULL;

    if ((item == NULL) || (array == NULL) || (array == item))
    {
        return false;
    }

    child = array->child;
    /*
     * To find the last item in array quickly, we use prev in array
     */
    if (child == NULL)
    {
        /* list is empty, start new one */
        array->child = item;
        item->prev = item;
        item->next = NULL;
    }
    else
    {
        /* append to the end */
        if (child->prev)
        {
            suffix_object(child->prev, item);
            array->child->prev = item;
        }
    }

    return true;
}